

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O1

int main(int argc,char **argv)

{
  list_entity **pplVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  long lVar4;
  avl_tree *paVar5;
  _func_int_void_ptr_void_ptr **pp_Var6;
  list_entity *plVar7;
  tree_element *ptVar8;
  list_entity **pplVar9;
  tree_element *ptVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  tree_element *ptVar14;
  tree_element *ptVar15;
  uint uVar16;
  uint uVar17;
  _func_int_void_ptr_void_ptr **pp_Var18;
  list_entity **pplVar19;
  uint uVar20;
  uint uVar21;
  _Bool _Var22;
  bool bVar23;
  uint32_t array [1000];
  _Bool local_fda;
  uint32_t local_fd8 [1002];
  
  BEGIN_TESTING(clear_elements);
  do_tests(false);
  do_tests(true);
  srand(0);
  cunit_start_test("test_random_insert");
  avl_init(&head,avl_comp_uint32,1);
  random_insert(local_fd8,1000);
  random_delete(local_fd8,500);
  random_insert(local_fd8,400);
  random_delete(local_fd8,600);
  plVar7 = head.list_head.next;
  pplVar1 = &(head.list_head.next)->next;
  head.list_head.prev = &head.list_head;
  head.list_head.next = &head.list_head;
  head.root = (avl_node *)0x0;
  plVar3 = *pplVar1;
  for (; plVar2 = plVar3, head.count != 0; head.count = head.count - 1) {
    free(&plVar7[-1].prev);
    plVar3 = plVar2->next;
    plVar7 = plVar2;
  }
  cunit_end_test("test_random_insert");
  cunit_start_test("test_for_each_key_macro");
  avl_init(&head,avl_comp_uint32,1);
  local_fd8[0] = 3;
  lVar4 = avl_find();
  pp_Var18 = (_func_int_void_ptr_void_ptr **)(lVar4 + -8);
  if (lVar4 == 0) {
    pp_Var18 = (_func_int_void_ptr_void_ptr **)0x0;
  }
  paVar5 = (avl_tree *)(pp_Var18 + 1);
  pp_Var6 = pp_Var18;
  if (paVar5 != &head && lVar4 != 0) {
    do {
      if ((pp_Var6 != pp_Var18) && (*(char *)((long)pp_Var6 + 0x39) != '\x01')) break;
      cunit_named_check(false,"test_for_each_key_macro",0x282,
                        "elements returned by loop over empty tree");
      paVar5 = (avl_tree *)(paVar5->list_head).next;
      pp_Var6 = &paVar5[-1].comp;
    } while (paVar5 != &head);
  }
  nodes[3].node.key = nodes + 3;
  avl_insert(&head,0x1081b8);
  additional_node1.value = 4;
  additional_node1.node.key = &additional_node1;
  avl_insert(&head,0x108278);
  additional_node2.value = 4;
  additional_node2.node.key = &additional_node2;
  avl_insert(&head,0x1082b8);
  local_fd8[0] = 4;
  lVar4 = avl_find(&head);
  ptVar10 = (tree_element *)(lVar4 + -8);
  if (lVar4 == 0) {
    ptVar10 = (tree_element *)0x0;
  }
  paVar5 = (avl_tree *)&ptVar10->node;
  local_fda = true;
  uVar21 = 0;
  uVar16 = 0;
  uVar17 = 0;
  uVar20 = 0;
  _Var22 = true;
  if (paVar5 != &head && lVar4 != 0) {
    iVar12 = 0;
    uVar20 = 0;
    uVar17 = 0;
    uVar16 = 0;
    ptVar14 = ptVar10;
    do {
      if ((ptVar14 != ptVar10) && ((ptVar14->node).follower != true)) break;
      if (ptVar14 == (tree_element *)0x1081b0) {
        uVar16 = uVar16 + 1;
      }
      else if (ptVar14 == &additional_node1) {
        uVar17 = uVar17 + 1;
      }
      else if (ptVar14 == &additional_node2) {
        uVar20 = uVar20 + 1;
      }
      else {
        iVar12 = iVar12 + 1;
      }
      paVar5 = (avl_tree *)(paVar5->list_head).next;
      ptVar14 = (tree_element *)&paVar5[-1].comp;
    } while (paVar5 != &head);
    _Var22 = iVar12 == 0;
  }
  cunit_named_check(uVar16 != 0,"test_for_each_key_macro",0x2a8,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar16 < 2,"test_for_each_key_macro",0x2a9,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar17 != 0,"test_for_each_key_macro",0x2aa,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar17 < 2,"test_for_each_key_macro",0x2ab,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar20 != 0,"test_for_each_key_macro",0x2ac,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar20 < 2,"test_for_each_key_macro",0x2ad,
                    "First node with key=4 returned multiple times");
  cunit_named_check(_Var22,"test_for_each_key_macro",0x2af,"Unknown node returned");
  nodes[2].node.key = nodes + 2;
  avl_insert(&head,0x108178);
  local_fd8[0] = 4;
  lVar4 = avl_find(&head);
  ptVar10 = (tree_element *)(lVar4 + -8);
  if (lVar4 == 0) {
    ptVar10 = (tree_element *)0x0;
  }
  paVar5 = (avl_tree *)&ptVar10->node;
  uVar17 = 0;
  uVar20 = 0;
  if (paVar5 != &head && lVar4 != 0) {
    iVar12 = 0;
    uVar20 = 0;
    uVar17 = 0;
    uVar21 = 0;
    ptVar14 = ptVar10;
    do {
      if ((ptVar14 != ptVar10) && ((ptVar14->node).follower != true)) break;
      if (ptVar14 == (tree_element *)0x1081b0) {
        uVar21 = uVar21 + 1;
      }
      else if (ptVar14 == &additional_node1) {
        uVar17 = uVar17 + 1;
      }
      else if (ptVar14 == &additional_node2) {
        uVar20 = uVar20 + 1;
      }
      else {
        iVar12 = iVar12 + 1;
      }
      paVar5 = (avl_tree *)(paVar5->list_head).next;
      ptVar14 = (tree_element *)&paVar5[-1].comp;
    } while (paVar5 != &head);
    local_fda = iVar12 == 0;
  }
  uVar16 = 0;
  cunit_named_check(uVar21 != 0,"test_for_each_key_macro",0x2cb,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar21 < 2,"test_for_each_key_macro",0x2cc,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar17 != 0,"test_for_each_key_macro",0x2cd,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar17 < 2,"test_for_each_key_macro",0x2ce,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar20 != 0,"test_for_each_key_macro",0x2cf,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar20 < 2,"test_for_each_key_macro",0x2d0,
                    "First node with key=4 returned multiple times");
  cunit_named_check(local_fda,"test_for_each_key_macro",0x2d2,"Unknown node returned");
  nodes[4].node.key = nodes + 4;
  avl_insert(&head,0x1081f8);
  local_fd8[0] = 4;
  lVar4 = avl_find(&head);
  ptVar10 = (tree_element *)(lVar4 + -8);
  if (lVar4 == 0) {
    ptVar10 = (tree_element *)0x0;
  }
  paVar5 = (avl_tree *)&ptVar10->node;
  _Var22 = true;
  uVar21 = 0;
  uVar20 = 0;
  if (paVar5 != &head && lVar4 != 0) {
    iVar12 = 0;
    uVar20 = 0;
    uVar21 = 0;
    uVar16 = 0;
    ptVar14 = ptVar10;
    do {
      if ((ptVar14 != ptVar10) && ((ptVar14->node).follower != true)) break;
      if (ptVar14 == (tree_element *)0x1081b0) {
        uVar16 = uVar16 + 1;
      }
      else if (ptVar14 == &additional_node1) {
        uVar21 = uVar21 + 1;
      }
      else if (ptVar14 == &additional_node2) {
        uVar20 = uVar20 + 1;
      }
      else {
        iVar12 = iVar12 + 1;
      }
      paVar5 = (avl_tree *)(paVar5->list_head).next;
      ptVar14 = (tree_element *)&paVar5[-1].comp;
    } while (paVar5 != &head);
    _Var22 = iVar12 == 0;
  }
  cunit_named_check(uVar16 != 0,"test_for_each_key_macro",0x2ee,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar16 < 2,"test_for_each_key_macro",0x2ef,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar21 != 0,"test_for_each_key_macro",0x2f0,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar21 < 2,"test_for_each_key_macro",0x2f1,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar20 != 0,"test_for_each_key_macro",0x2f2,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar20 < 2,"test_for_each_key_macro",0x2f3,
                    "First node with key=4 returned multiple times");
  cunit_named_check(_Var22,"test_for_each_key_macro",0x2f5,"Unknown node returned");
  local_fd8[0] = 3;
  lVar4 = avl_find();
  pp_Var18 = (_func_int_void_ptr_void_ptr **)(lVar4 + -8);
  if (lVar4 == 0) {
    pp_Var18 = (_func_int_void_ptr_void_ptr **)0x0;
  }
  paVar5 = (avl_tree *)(pp_Var18 + 1);
  _Var22 = false;
  if (paVar5 != &head && lVar4 != 0) {
    iVar12 = 0;
    pp_Var6 = pp_Var18;
    do {
      if ((pp_Var6 != pp_Var18) && (*(char *)((long)pp_Var6 + 0x39) != '\x01')) break;
      if (iVar12 == 0) {
        iVar13 = 0x2fe;
        pcVar11 = "First node with key=3 not returned first";
      }
      else {
        iVar13 = 0x301;
        pcVar11 = "More than one element with key=3 returned";
      }
      cunit_named_check(iVar12 == 0 && pp_Var6 == (_func_int_void_ptr_void_ptr **)0x108170,
                        "test_for_each_key_macro",iVar13,pcVar11);
      paVar5 = (avl_tree *)(paVar5->list_head).next;
      pp_Var6 = &paVar5[-1].comp;
      iVar12 = iVar12 + 1;
    } while (paVar5 != &head);
    _Var22 = iVar12 != 0;
  }
  cunit_named_check(_Var22,"test_for_each_key_macro",0x306,"Less than one nodes returned");
  local_fd8[0] = 6;
  lVar4 = avl_find();
  pp_Var18 = (_func_int_void_ptr_void_ptr **)(lVar4 + -8);
  if (lVar4 == 0) {
    pp_Var18 = (_func_int_void_ptr_void_ptr **)0x0;
  }
  paVar5 = (avl_tree *)(pp_Var18 + 1);
  pp_Var6 = pp_Var18;
  if (paVar5 != &head && lVar4 != 0) {
    do {
      if ((pp_Var6 != pp_Var18) && (*(char *)((long)pp_Var6 + 0x39) != '\x01')) break;
      cunit_named_check(false,"test_for_each_key_macro",0x30a,
                        "Element returned by loop over non-existing key");
      paVar5 = (avl_tree *)(paVar5->list_head).next;
      pp_Var6 = &paVar5[-1].comp;
    } while (paVar5 != &head);
  }
  cunit_end_test("test_for_each_key_macro");
  cunit_start_test("test_for_each_key_safe_macro1");
  avl_init(&head,avl_comp_uint32,1);
  local_fd8[0] = 3;
  plVar7 = (list_entity *)avl_find();
  pplVar1 = &plVar7[-1].prev;
  if (plVar7 == (list_entity *)0x0) {
    pplVar1 = (list_entity **)0x0;
LAB_00101a73:
    pplVar19 = (list_entity **)0x0;
  }
  else {
    if (head.list_head.prev == plVar7) goto LAB_00101a73;
    pplVar19 = &plVar7->next[-1].prev;
  }
  pplVar9 = pplVar1;
  if (pplVar1 != (list_entity **)0x1080b8 && plVar7 != (list_entity *)0x0) {
    do {
      if (((pplVar9 != pplVar1) && (*(char *)((long)pplVar9 + 0x39) != '\x01')) ||
         (cunit_named_check(false,"test_for_each_key_safe_macro1",0x31c,
                            "elements returned by loop over empty tree"),
         pplVar19 == (list_entity **)0x0)) break;
      bVar23 = pplVar19 != (list_entity **)0x1080b8;
      pplVar9 = pplVar19;
      pplVar19 = (list_entity **)((long)pplVar19[1] + -8);
    } while (bVar23);
  }
  nodes[3].node.key = nodes + 3;
  avl_insert(&head,0x1081b8);
  additional_node1.value = 4;
  additional_node1.node.key = &additional_node1;
  avl_insert(&head,0x108278);
  additional_node2.value = 4;
  additional_node2.node.key = &additional_node2;
  avl_insert(&head,0x1082b8);
  local_fd8[0] = 4;
  plVar7 = (list_entity *)avl_find(&head);
  ptVar10 = (tree_element *)&plVar7[-1].prev;
  uVar20 = 0;
  if (plVar7 == (list_entity *)0x0) {
    ptVar10 = (tree_element *)0x0;
LAB_00101b83:
    ptVar14 = (tree_element *)0x0;
  }
  else {
    if (head.list_head.prev == plVar7) goto LAB_00101b83;
    ptVar14 = (tree_element *)&plVar7->next[-1].prev;
  }
  _Var22 = true;
  uVar17 = 0;
  uVar21 = 0;
  if (ptVar10 != (tree_element *)0x1080b8 && plVar7 != (list_entity *)0x0) {
    iVar12 = 0;
    uVar21 = 0;
    uVar17 = 0;
    uVar20 = 0;
    ptVar8 = ptVar10;
    while ((ptVar15 = ptVar14, ptVar8 == ptVar10 || ((ptVar8->node).follower == true))) {
      if (ptVar8 == nodes + 3) {
        uVar20 = uVar20 + 1;
      }
      else if (ptVar8 == &additional_node1) {
        uVar17 = uVar17 + 1;
      }
      else if (ptVar8 == &additional_node2) {
        uVar21 = uVar21 + 1;
      }
      else {
        iVar12 = iVar12 + 1;
      }
      if ((ptVar15 == (tree_element *)0x0) ||
         (ptVar14 = (tree_element *)&(ptVar15->node).list.next[-1].prev, ptVar8 = ptVar15,
         ptVar15 == (tree_element *)0x1080b8)) break;
    }
    _Var22 = iVar12 == 0;
  }
  uVar16 = 0;
  cunit_named_check(uVar20 != 0,"test_for_each_key_safe_macro1",0x342,
                    "First node with key=4 not returned");
  cunit_named_check(uVar20 < 2,"test_for_each_key_safe_macro1",0x343,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar17 != 0,"test_for_each_key_safe_macro1",0x344,
                    "First node with key=4 not returned");
  cunit_named_check(uVar17 < 2,"test_for_each_key_safe_macro1",0x345,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar21 != 0,"test_for_each_key_safe_macro1",0x346,
                    "First node with key=4 not returned");
  cunit_named_check(uVar21 < 2,"test_for_each_key_safe_macro1",0x347,
                    "First node with key=4 returned multiple times");
  cunit_named_check(_Var22,"test_for_each_key_safe_macro1",0x349,"Unknown node returned");
  nodes[2].node.key = nodes + 2;
  avl_insert(&head,0x108178);
  local_fd8[0] = 4;
  plVar7 = (list_entity *)avl_find(&head);
  ptVar10 = (tree_element *)&plVar7[-1].prev;
  if (plVar7 == (list_entity *)0x0) {
    ptVar10 = (tree_element *)0x0;
LAB_00101d51:
    ptVar14 = (tree_element *)0x0;
  }
  else {
    if (head.list_head.prev == plVar7) goto LAB_00101d51;
    ptVar14 = (tree_element *)&plVar7->next[-1].prev;
  }
  _Var22 = true;
  uVar21 = 0;
  uVar20 = 0;
  if (ptVar10 != (tree_element *)0x1080b8 && plVar7 != (list_entity *)0x0) {
    iVar12 = 0;
    uVar20 = 0;
    uVar21 = 0;
    uVar16 = 0;
    ptVar8 = ptVar10;
    while ((ptVar15 = ptVar14, ptVar8 == ptVar10 || ((ptVar8->node).follower == true))) {
      if (ptVar8 == nodes + 3) {
        uVar16 = uVar16 + 1;
      }
      else if (ptVar8 == &additional_node1) {
        uVar21 = uVar21 + 1;
      }
      else if (ptVar8 == &additional_node2) {
        uVar20 = uVar20 + 1;
      }
      else {
        iVar12 = iVar12 + 1;
      }
      if ((ptVar15 == (tree_element *)0x0) ||
         (ptVar14 = (tree_element *)&(ptVar15->node).list.next[-1].prev, ptVar8 = ptVar15,
         ptVar15 == (tree_element *)0x1080b8)) break;
    }
    _Var22 = iVar12 == 0;
  }
  uVar17 = 0;
  cunit_named_check(uVar16 != 0,"test_for_each_key_safe_macro1",0x365,
                    "First node with key=4 not returned");
  cunit_named_check(uVar16 < 2,"test_for_each_key_safe_macro1",0x366,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar21 != 0,"test_for_each_key_safe_macro1",0x367,
                    "First node with key=4 not returned");
  cunit_named_check(uVar21 < 2,"test_for_each_key_safe_macro1",0x368,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar20 != 0,"test_for_each_key_safe_macro1",0x369,
                    "First node with key=4 not returned");
  cunit_named_check(uVar20 < 2,"test_for_each_key_safe_macro1",0x36a,
                    "First node with key=4 returned multiple times");
  cunit_named_check(_Var22,"test_for_each_key_safe_macro1",0x36c,"Unknown node returned");
  nodes[4].node.key = nodes + 4;
  avl_insert(&head,0x1081f8);
  local_fd8[0] = 4;
  plVar7 = (list_entity *)avl_find(&head);
  ptVar10 = (tree_element *)&plVar7[-1].prev;
  if (plVar7 == (list_entity *)0x0) {
    ptVar10 = (tree_element *)0x0;
  }
  else if (head.list_head.prev != plVar7) {
    ptVar14 = (tree_element *)&plVar7->next[-1].prev;
    goto LAB_00101f25;
  }
  ptVar14 = (tree_element *)0x0;
LAB_00101f25:
  _Var22 = true;
  uVar21 = 0;
  uVar20 = 0;
  if (ptVar10 != (tree_element *)0x1080b8 && plVar7 != (list_entity *)0x0) {
    iVar12 = 0;
    uVar20 = 0;
    uVar21 = 0;
    uVar17 = 0;
    ptVar8 = ptVar10;
    while ((ptVar15 = ptVar14, ptVar8 == ptVar10 || ((ptVar8->node).follower == true))) {
      if (ptVar8 == nodes + 3) {
        uVar17 = uVar17 + 1;
      }
      else if (ptVar8 == &additional_node1) {
        uVar21 = uVar21 + 1;
      }
      else if (ptVar8 == &additional_node2) {
        uVar20 = uVar20 + 1;
      }
      else {
        iVar12 = iVar12 + 1;
      }
      if ((ptVar15 == (tree_element *)0x0) ||
         (ptVar14 = (tree_element *)&(ptVar15->node).list.next[-1].prev, ptVar8 = ptVar15,
         ptVar15 == (tree_element *)0x1080b8)) break;
    }
    _Var22 = iVar12 == 0;
  }
  ptVar14 = (tree_element *)0x0;
  cunit_named_check(uVar17 != 0,"test_for_each_key_safe_macro1",0x388,
                    "First node with key=4 not returned");
  cunit_named_check(uVar17 < 2,"test_for_each_key_safe_macro1",0x389,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar21 != 0,"test_for_each_key_safe_macro1",0x38a,
                    "First node with key=4 not returned");
  cunit_named_check(uVar21 < 2,"test_for_each_key_safe_macro1",0x38b,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar20 != 0,"test_for_each_key_safe_macro1",0x38c,
                    "First node with key=4 not returned");
  cunit_named_check(uVar20 < 2,"test_for_each_key_safe_macro1",0x38d,
                    "First node with key=4 returned multiple times");
  cunit_named_check(_Var22,"test_for_each_key_safe_macro1",0x38f,"Unknown node returned");
  local_fd8[0] = 3;
  plVar7 = (list_entity *)avl_find();
  ptVar10 = (tree_element *)&plVar7[-1].prev;
  if (plVar7 == (list_entity *)0x0) {
    ptVar10 = (tree_element *)0x0;
  }
  else if (head.list_head.prev == plVar7) {
    ptVar14 = (tree_element *)0x0;
  }
  else {
    ptVar14 = (tree_element *)&plVar7->next[-1].prev;
  }
  _Var22 = false;
  if (ptVar10 != (tree_element *)0x1080b8 && plVar7 != (list_entity *)0x0) {
    iVar12 = 0;
    ptVar8 = ptVar10;
    while ((ptVar8 == ptVar10 || ((ptVar8->node).follower == true))) {
      if (iVar12 == 0) {
        iVar13 = 0x398;
        pcVar11 = "First node with key=3 not returned first";
      }
      else {
        iVar13 = 0x39b;
        pcVar11 = "More than one element with key=3 returned";
      }
      cunit_named_check(iVar12 == 0 && ptVar8 == nodes + 2,"test_for_each_key_safe_macro1",iVar13,
                        pcVar11);
      iVar12 = iVar12 + 1;
      if ((ptVar14 == (tree_element *)0x0) ||
         (bVar23 = ptVar14 == (tree_element *)0x1080b8, ptVar8 = ptVar14,
         ptVar14 = (tree_element *)&(ptVar14->node).list.next[-1].prev, bVar23)) break;
    }
    _Var22 = iVar12 != 0;
  }
  pplVar19 = (list_entity **)0x0;
  cunit_named_check(_Var22,"test_for_each_key_safe_macro1",0x3a0,"Less than one nodes returned");
  local_fd8[0] = 6;
  plVar7 = (list_entity *)avl_find();
  pplVar1 = &plVar7[-1].prev;
  if (plVar7 == (list_entity *)0x0) {
    pplVar1 = (list_entity **)0x0;
  }
  else if (head.list_head.prev == plVar7) {
    pplVar19 = (list_entity **)0x0;
  }
  else {
    pplVar19 = &plVar7->next[-1].prev;
  }
  pplVar9 = pplVar1;
  if (pplVar1 != (list_entity **)0x1080b8 && plVar7 != (list_entity *)0x0) {
    do {
      if (((pplVar9 != pplVar1) && (*(char *)((long)pplVar9 + 0x39) != '\x01')) ||
         (cunit_named_check(false,"test_for_each_key_safe_macro1",0x3a4,
                            "Element returned by loop over non-existing key"),
         pplVar19 == (list_entity **)0x0)) break;
      bVar23 = pplVar19 != (list_entity **)0x1080b8;
      pplVar9 = pplVar19;
      pplVar19 = (list_entity **)((long)pplVar19[1] + -8);
    } while (bVar23);
  }
  cunit_end_test("test_for_each_key_safe_macro1");
  iVar12 = FINISH_TESTING();
  return iVar12;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(clear_elements);

  do_tests(false);
  do_tests(true);
  test_random_insert();
  test_for_each_key_macro();
  test_for_each_key_safe_macro1();

  //TODO: test removal in for_each_key_safe

  return FINISH_TESTING();
}